

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

int argumentList(int isPrototype,object *proc,int parBlkSize)

{
  object *local_28;
  object *first;
  int parSize;
  int parBlkSize_local;
  object *proc_local;
  int isPrototype_local;
  
  if (isPrototype == 1) {
    first._0_4_ = prototypeArgument(parBlkSize);
  }
  else {
    local_28 = proc->dsc;
    first._0_4_ = argument(proc,parBlkSize,local_28);
    if (proc->hasPrototype == 1) {
      local_28 = local_28->next;
    }
  }
  while (currentSymbol == 0xcc) {
    getSymbol();
    if (isPrototype == 1) {
      first._0_4_ = prototypeArgument((int)first);
    }
    else if (proc->hasPrototype == 1) {
      if (local_28 == guard) {
        mark("number of args differ");
        exit(-1);
      }
      first._0_4_ = argument(proc,(int)first,local_28);
      local_28 = local_28->next;
    }
    else {
      first._0_4_ = argument(proc,(int)first,local_28);
    }
  }
  if (((isPrototype == 0) && (proc->hasPrototype == 1)) && (local_28 != guard)) {
    mark("prototype requires more arguments");
    exit(-1);
  }
  return (int)first;
}

Assistant:

procedure 
int argumentList(int isPrototype, struct object *proc, int parBlkSize) {
	variable int parSize; 
	variable struct object *first;
	parSize = 0; 
	if (isPrototype==1) {
		parSize = prototypeArgument(parBlkSize);
	} else {
		first = proc->dsc; /* not next because we are still at the head */
		parSize = argument(proc,parBlkSize,first);
		if (proc->hasPrototype == true) {
			first = first->next; /* next argument (might be guard) */
		}
	}
	while (currentSymbol == SYMBOL_COMMA) {
		getSymbol();
		if (isPrototype==1) {
			parSize = prototypeArgument(parSize);
		} else {
			if (proc->hasPrototype == true) {
				if (first == guard) {
					mark("number of args differ");
					exit(-1);
				}
				parSize = argument(proc,parSize,first);
				first = first->next;
			} else {
				parSize = argument(proc,parSize,first);
			}
		}
		
	}
	if ((isPrototype == 0) && (proc->hasPrototype == true)) {
		if (first != guard) {
			mark("prototype requires more arguments");
			exit(-1);
		}
	}
	return parSize;
}